

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

JSON __thiscall
qpdf::Stream::getStreamJSON
          (Stream *this,int json_version,qpdf_json_stream_data_e json_data,
          qpdf_stream_decode_level_e decode_level,Pipeline *p,string *data_filename)

{
  string *key;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  qpdf_stream_decode_level_e qVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  JSON JVar4;
  string *in_stack_00000008;
  allocator<char> local_121;
  string *local_120;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_118;
  qpdf_stream_decode_level_e local_108;
  undefined1 local_f8 [16];
  string local_e8;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  JSON local_90;
  Pl_Buffer pb;
  Writer jw;
  
  local_120 = (string *)this;
  Pl_Buffer::Pl_Buffer(&pb,"streamjson",(Pipeline *)0x0);
  jw.first = true;
  jw.indent = 0;
  jw.p = &pb.super_Pipeline;
  qVar3 = writeStreamJSON((Stream *)CONCAT44(in_register_00000034,json_version),json_data,&jw,
                          decode_level,(qpdf_stream_decode_level_e)p,(Pipeline *)data_filename,
                          in_stack_00000008,true);
  Pl_Buffer::finish(&pb);
  Pl_Buffer::getString_abi_cxx11_(&local_e8,&pb);
  key = local_120;
  JSON::parse((JSON *)local_120,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (decode_level == qpdf_dl_generalized) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"data",&local_121);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(in_register_00000034,json_version));
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_118,&local_a0);
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_b8 = (code *)0x0;
    pcStack_b0 = (code *)0x0;
    local_108 = qVar3;
    local_c8._M_unused._M_object = operator_new(0x18);
    _Var2._M_pi = local_118._M_refcount._M_pi;
    peVar1 = local_118._M_ptr;
    local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._M_ptr = (element_type *)0x0;
    *(element_type **)local_c8._M_unused._0_8_ = peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c8._M_unused._0_8_ + 8) =
         _Var2._M_pi;
    *(qpdf_stream_decode_level_e *)((long)local_c8._M_unused._0_8_ + 0x10) = qVar3;
    pcStack_b0 = std::
                 _Function_handler<void_(Pipeline_*),_(anonymous_namespace)::StreamBlobProvider>::
                 _M_invoke;
    local_b8 = std::_Function_handler<void_(Pipeline_*),_(anonymous_namespace)::StreamBlobProvider>
               ::_M_manager;
    JSON::makeBlob((function<void_(Pipeline_*)> *)local_f8);
    JSON::addDictionaryMember(&local_90,key,(JSON *)&local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  Pl_Buffer::~Pl_Buffer(&pb);
  JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)key
  ;
  return (JSON)JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
Stream::getStreamJSON(
    int json_version,
    qpdf_json_stream_data_e json_data,
    qpdf_stream_decode_level_e decode_level,
    Pipeline* p,
    std::string const& data_filename)
{
    Pl_Buffer pb{"streamjson"};
    JSON::Writer jw{&pb, 0};
    decode_level =
        writeStreamJSON(json_version, jw, json_data, decode_level, p, data_filename, true);
    pb.finish();
    auto result = JSON::parse(pb.getString());
    if (json_data == qpdf_sj_inline) {
        result.addDictionaryMember("data", JSON::makeBlob(StreamBlobProvider(*this, decode_level)));
    }
    return result;
}